

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall SQStringTable::Remove(SQStringTable *this,SQString *bs)

{
  ulong uVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  SQInteger slen;
  SQHash h;
  SQString *prev;
  SQString *s;
  SQAllocContext ctx;
  undefined8 *local_20;
  undefined8 *local_18;
  
  local_20 = (undefined8 *)0x0;
  uVar1 = in_RSI[6] & in_RDI[1] - 1U;
  local_18 = *(undefined8 **)(*in_RDI + uVar1 * 8);
  while( true ) {
    if (local_18 == (undefined8 *)0x0) {
      return;
    }
    if (local_18 == in_RSI) break;
    local_20 = local_18;
    local_18 = (undefined8 *)local_18[4];
  }
  if (local_20 == (undefined8 *)0x0) {
    *(undefined8 *)(*in_RDI + uVar1 * 8) = local_18[4];
  }
  else {
    local_20[4] = local_18[4];
  }
  in_RDI[2] = in_RDI[2] + -1;
  ctx = (SQAllocContext)local_18[5];
  (**(code **)*local_18)();
  sq_vm_free(ctx,in_RDI,0x16477d);
  return;
}

Assistant:

void SQStringTable::Remove(SQString *bs)
{
    SQString *s;
    SQString *prev=NULL;
    SQHash h = bs->_hash&(_numofslots - 1);

    for (s = _strings[h]; s; ){
        if(s == bs){
            if(prev)
                prev->_next = s->_next;
            else
                _strings[h] = s->_next;
            _slotused--;
            SQInteger slen = s->_len;
            s->~SQString();
            SQ_FREE(_sharedstate->_alloc_ctx, s, sizeof(SQString) + slen);
            return;
        }
        prev = s;
        s = s->_next;
    }
    assert(0);//if this fail something is wrong
}